

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test::testBody
          (TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test *this)

{
  int iVar1;
  UtestShell *test;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SimpleString local_1a0;
  SimpleString local_190;
  SimpleString local_180;
  SimpleString local_170;
  SimpleString local_160;
  SimpleString local_150;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  undefined1 local_b0 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockCallTest_ignoreOtherCallsExceptForTheUnExpectedOne_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"lazy");
  MockExpectedCallsListForTest::addFunction
            ((MockExpectedCallsListForTest *)local_28,0,
             (SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_c0,"lazy");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_b0,test,&local_c0,
             (MockExpectedCallsList *)local_28);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::SimpleString(&local_d0,"");
  pMVar2 = mock(&local_d0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"lazy");
  (*pMVar2->_vptr_MockSupport[4])(pMVar2,&local_e0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_d0);
  SimpleString::SimpleString(&local_f0,"");
  pMVar2 = mock(&local_f0,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x24])();
  SimpleString::~SimpleString(&local_f0);
  SimpleString::SimpleString(&local_100,"");
  pMVar2 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_110,"bar");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_110);
  SimpleString::SimpleString(&local_120,"foo");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var,iVar1),&local_120,1);
  SimpleString::~SimpleString(&local_120);
  SimpleString::~SimpleString(&local_110);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_130,"");
  pMVar2 = mock(&local_130,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_140,"bar1");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_140);
  SimpleString::SimpleString(&local_150,"foo");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_150,1);
  SimpleString::~SimpleString(&local_150);
  SimpleString::~SimpleString(&local_140);
  SimpleString::~SimpleString(&local_130);
  SimpleString::SimpleString(&local_160,"");
  pMVar2 = mock(&local_160,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_170,"bar2");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_170);
  SimpleString::SimpleString(&local_180,"foo");
  MockActualCall::withParameter((MockActualCall *)CONCAT44(extraout_var_01,iVar1),&local_180,1);
  SimpleString::~SimpleString(&local_180);
  SimpleString::~SimpleString(&local_170);
  SimpleString::~SimpleString(&local_160);
  SimpleString::SimpleString(&local_190,"");
  pMVar2 = mock(&local_190,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_1a0,"lazy");
  (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_1a0);
  SimpleString::~SimpleString(&local_1a0);
  SimpleString::~SimpleString(&local_190);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x101);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_b0);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsExceptForTheUnExpectedOne)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction(0, "lazy");
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "lazy", expectations);

    mock().expectNoCall("lazy");
    mock().ignoreOtherCalls();
    mock().actualCall("bar").withParameter("foo", 1);
    mock().actualCall("bar1").withParameter("foo", 1);
    mock().actualCall("bar2").withParameter("foo", 1);
    mock().actualCall("lazy");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}